

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.cpp
# Opt level: O2

u32 duckdb_fsst_export(duckdb_fsst_encoder_t *encoder,u8 *buf)

{
  u32 i;
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  duckdb_fsst_encoder_t pvVar4;
  ulong uVar5;
  ulong uVar6;
  
  pvVar4 = *encoder;
  *(ulong *)buf =
       (ulong)*(ushort *)((long)pvVar4 + 0x26200) << 8 | 0x134140a00000001 |
       (ulong)(uint)(*(int *)((long)pvVar4 + 0x26204) << 0x10) |
       (ulong)*(ushort *)((long)pvVar4 + 0x26202) << 0x18;
  buf[8] = *(u8 *)((long)*encoder + 0x26206);
  for (lVar1 = 0; pvVar4 = *encoder, lVar1 != 8; lVar1 = lVar1 + 1) {
    buf[lVar1 + 9] = *(u8 *)((long)pvVar4 + lVar1 * 2 + 0x26208);
  }
  uVar5 = (ulong)*(byte *)((long)pvVar4 + 0x26206) << 4 | 0x20200;
  uVar2 = 0x11;
  for (uVar3 = (ulong)*(byte *)((long)pvVar4 + 0x26206); uVar3 < *(ushort *)((long)pvVar4 + 0x26200)
      ; uVar3 = uVar3 + 1) {
    for (uVar6 = 0; uVar6 < (*(ulong *)((long)pvVar4 + uVar3 * 0x10 + 0x20208) >> 0x1c & 0xffffffff)
        ; uVar6 = uVar6 + 1) {
      buf[uVar2 + uVar6 & 0xffffffff] = *(u8 *)((long)pvVar4 + uVar6 + uVar5);
      pvVar4 = *encoder;
    }
    uVar5 = uVar5 + 0x10;
    uVar2 = (ulong)((u32)uVar2 + (int)uVar6);
  }
  return (u32)uVar2;
}

Assistant:

u32 duckdb_fsst_export(duckdb_fsst_encoder_t *encoder, u8 *buf) {
	Encoder *e = (Encoder*) encoder;
	// In ->version there is a versionnr, but we hide also suffixLim/terminator/nSymbols there.
	// This is sufficient in principle to *reconstruct* a duckdb_fsst_encoder_t from a duckdb_fsst_decoder_t
	// (such functionality could be useful to append compressed data to an existing block).
	//
	// However, the hash function in the encoder hash table is endian-sensitive, and given its
	// 'lossy perfect' hashing scheme is *unable* to contain other-endian-produced symbol tables.
	// Doing a endian-conversion during hashing will be slow and self-defeating.
	//
	// Overall, we could support reconstructing an encoder for incremental compression, but
	// should enforce equal-endianness. Bit of a bummer. Not going there now.
	//
	// The version field is now there just for future-proofness, but not used yet

	// version allows keeping track of fsst versions, track endianness, and encoder reconstruction
	u64 version = (FSST_VERSION << 32) |  // version is 24 bits, most significant byte is 0
	              (((u64) e->symbolTable->suffixLim) << 24) |
	              (((u64) e->symbolTable->terminator) << 16) |
	              (((u64) e->symbolTable->nSymbols) << 8) |
	              FSST_ENDIAN_MARKER; // least significant byte is nonzero

	/* do not assume unaligned reads here */
	memcpy(buf, &version, 8);
	buf[8] = e->symbolTable->zeroTerminated;
	for(u32 i=0; i<8; i++)
		buf[9+i] = (u8) e->symbolTable->lenHisto[i];
	u32 pos = 17;

	// emit only the used bytes of the symbols
	for(u32 i = e->symbolTable->zeroTerminated; i < e->symbolTable->nSymbols; i++)
		for(u32 j = 0; j < e->symbolTable->symbols[i].length(); j++)
			buf[pos++] = e->symbolTable->symbols[i].val.str[j]; // serialize used symbol bytes

	return pos; // length of what was serialized
}